

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O3

void __thiscall List<String>::merge(List<String> *this,List<String> *other)

{
  _Map_pointer ppSVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  _Deque_iterator<String,_const_String_&,_const_String_*> local_98;
  _Deque_iterator<String,_const_String_&,_const_String_*> local_78;
  _Deque_iterator<String,_String_&,_String_*> local_58;
  _Deque_iterator<String,_String_&,_String_*> local_38;
  
  ppSVar1 = (this->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar4 = (int)((ulong)((long)(this->_deque).super__Deque_base<String,_std::allocator<String>_>.
                              _M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)(this->_deque).super__Deque_base<String,_std::allocator<String>_>.
                             _M_impl.super__Deque_impl_data._M_start._M_cur) >> 5) +
          (int)((ulong)((long)(this->_deque).super__Deque_base<String,_std::allocator<String>_>.
                              _M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)(this->_deque).super__Deque_base<String,_std::allocator<String>_>.
                             _M_impl.super__Deque_impl_data._M_finish._M_first) >> 5) +
          ((int)((ulong)((long)ppSVar1 -
                        (long)(this->_deque).super__Deque_base<String,_std::allocator<String>_>.
                              _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
          (uint)(ppSVar1 == (_Map_pointer)0x0)) * 0x10;
  ppSVar1 = (other->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  std::deque<String,_std::allocator<String>_>::resize
            (&this->_deque,
             (long)(int)((int)((ulong)((long)(other->_deque).
                                             super__Deque_base<String,_std::allocator<String>_>.
                                             _M_impl.super__Deque_impl_data._M_start._M_last -
                                      (long)(other->_deque).
                                            super__Deque_base<String,_std::allocator<String>_>.
                                            _M_impl.super__Deque_impl_data._M_start._M_cur) >> 5) +
                         (int)((ulong)((long)(other->_deque).
                                             super__Deque_base<String,_std::allocator<String>_>.
                                             _M_impl.super__Deque_impl_data._M_finish._M_cur -
                                      (long)(other->_deque).
                                            super__Deque_base<String,_std::allocator<String>_>.
                                            _M_impl.super__Deque_impl_data._M_finish._M_first) >> 5)
                         + iVar4 +
                        ((((uint)((int)ppSVar1 -
                                 *(int *)&(other->_deque).
                                          super__Deque_base<String,_std::allocator<String>_>._M_impl
                                          .super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                        (uint)(ppSVar1 == (_Map_pointer)0x0)) * 0x10));
  local_78._M_cur =
       (other->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_78._M_first =
       (other->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_78._M_last =
       (other->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_78._M_node =
       (other->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_98._M_cur =
       (other->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_finish._M_cur;
  local_98._M_first =
       (other->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_finish._M_first;
  local_98._M_last =
       (other->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_finish._M_last;
  local_98._M_node =
       (other->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_finish._M_node;
  local_58._M_cur =
       (this->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_58._M_first =
       (this->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_58._M_node =
       (this->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  uVar3 = ((long)local_58._M_cur - (long)local_58._M_first >> 5) + (long)iVar4;
  if ((long)uVar3 < 0) {
    uVar2 = (long)uVar3 >> 4;
  }
  else {
    if (uVar3 < 0x10) {
      local_58._M_last =
           (this->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
           super__Deque_impl_data._M_start._M_last;
      local_58._M_cur = local_58._M_cur + iVar4;
      goto LAB_00111dac;
    }
    uVar2 = uVar3 >> 4;
  }
  local_58._M_node = local_58._M_node + uVar2;
  local_58._M_first = *local_58._M_node;
  local_58._M_last = local_58._M_first + 0x10;
  local_58._M_cur = local_58._M_first + uVar3 + uVar2 * -0x10;
LAB_00111dac:
  std::__copy_move_a1<false,String,String_const&,String_const*,String>
            (&local_38,&local_78,&local_98,&local_58);
  return;
}

Assistant:

void List<T>::merge (const List<T>& other)
{
	int oldsize = size();
	resize (size() + other.size());
	std::copy (other.begin(), other.end(), begin() + oldsize);
}